

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64 __thiscall google::protobuf::Arena::FreeBlocks(Arena *this)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  uint64 uVar4;
  
  puVar3 = *(undefined8 **)(this + 8);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = (undefined8 *)0x0;
    uVar4 = 0;
  }
  else {
    uVar4 = puVar3[3];
    for (puVar1 = (undefined8 *)puVar3[1]; puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)puVar1[1]) {
      (**(code **)(this + 0x68))(puVar3);
      uVar4 = uVar4 + puVar1[3];
      puVar3 = puVar1;
    }
    if (this[0x28] == (Arena)0x1) {
      (**(code **)(this + 0x68))(puVar3);
      puVar3 = (undefined8 *)0x0;
    }
  }
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (this[0x28] == (Arena)0x0) {
    puVar3[2] = 0x20;
    puVar1 = (undefined8 *)__tls_get_addr(&PTR_0070e5d0);
    *puVar3 = puVar1;
    puVar1[1] = puVar3;
    *puVar1 = *(undefined8 *)this;
    puVar3[1] = *(undefined8 *)(this + 8);
    *(undefined8 **)(this + 8) = puVar3;
    lVar2 = puVar3[3];
    if (lVar2 != puVar3[2]) {
      *(undefined8 **)(this + 0x10) = puVar3;
      lVar2 = puVar3[3];
    }
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + lVar2;
  }
  return uVar4;
}

Assistant:

uint64 Arena::FreeBlocks() {
  uint64 space_allocated = 0;
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::NoBarrier_Load(&blocks_));
  Block* first_block = NULL;
  while (b != NULL) {
    space_allocated += (b->size);
    Block* next = b->next;
    if (next != NULL) {
#ifdef ADDRESS_SANITIZER
      // This memory was provided by the underlying allocator as unpoisoned, so
      // return it in an unpoisoned state.
      ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
      options_.block_dealloc(b, b->size);
    } else {
      if (owns_first_block_) {
#ifdef ADDRESS_SANITIZER
        // This memory was provided by the underlying allocator as unpoisoned,
        // so return it in an unpoisoned state.
        ASAN_UNPOISON_MEMORY_REGION(reinterpret_cast<char*>(b), b->size);
#endif  // ADDRESS_SANITIZER
        options_.block_dealloc(b, b->size);
      } else {
        // User passed in the first block, skip free'ing the memory.
        first_block = b;
      }
    }
    b = next;
  }
  blocks_ = 0;
  hint_ = 0;
  space_allocated_ = 0;
  if (!owns_first_block_) {
    // Make the first block that was passed in through ArenaOptions
    // available for reuse.
    first_block->pos = kHeaderSize;
    // Thread which calls Reset() owns the first block. This allows the
    // single-threaded case to allocate on the first block without taking any
    // locks.
    first_block->owner = &thread_cache();
    SetThreadCacheBlock(first_block);
    AddBlockInternal(first_block);
  }
  return space_allocated;
}